

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

HaU32 HACD::kmeans_cluster<HACD::Vec3d<float>,float>
                (Vec3d<float> *input,HaU32 inputCount,HaU32 clumpCount,Vec3d<float> *clusters,
                HaU32 *outputIndices,float threshold,float collapseDistance)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  size_t __size;
  HaU32 i;
  int *__s;
  void *__s_00;
  ulong uVar5;
  uint uVar6;
  float *pfVar7;
  int *piVar8;
  ulong uVar9;
  Vec3d<float> *pVVar10;
  HaU32 HVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  ushort uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 in_XMM11 [16];
  
  uVar13 = (ulong)clumpCount;
  __s = (int *)malloc(uVar13 * 4);
  if (clumpCount < inputCount) {
    __size = uVar13 * 0xc;
    __s_00 = malloc(__size);
    if (clumpCount != 0) {
      uVar6 = 0;
      sVar12 = 0;
      do {
        uVar5 = (ulong)uVar6 / (ulong)clumpCount;
        if (inputCount <= (uint)uVar5) {
          __assert_fail("index >= 0 && index < inputCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x2a5,
                        "hacd::HaU32 HACD::kmeans_cluster(const Vec *, hacd::HaU32, hacd::HaU32, Vec *, hacd::HaU32 *, Type, Type) [Vec = HACD::Vec3d<float>, Type = float]"
                       );
        }
        uVar6 = uVar6 + inputCount;
        *(float *)((long)&clusters->z + sVar12) = input[uVar5].z;
        *(undefined8 *)((long)&clusters->x + sVar12) = *(undefined8 *)(input + uVar5);
        sVar12 = sVar12 + 0xc;
      } while (__size != sVar12);
    }
    iVar15 = 0x40;
    fVar33 = 3.4028235e+38;
    do {
      if (clumpCount != 0) {
        memset(__s,0,uVar13 * 4);
        memset(__s_00,0,__size);
      }
      fVar27 = 0.0;
      uVar5 = 0;
      do {
        fVar31 = 3.4028235e+38;
        uVar14._0_4_ = input[uVar5].x;
        uVar14._4_4_ = input[uVar5].y;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar14;
        fVar28 = input[uVar5].z;
        if (clumpCount != 0) {
          auVar18 = vmovshdup_avx(auVar18);
          uVar9 = 0;
          auVar32 = ZEXT1664(SUB6416(ZEXT464(0x7f7fffff),0));
          pfVar7 = &clusters->z;
          do {
            fVar31 = auVar18._0_4_ - pfVar7[-1];
            auVar29 = ZEXT416((uint)((float)(undefined4)uVar14 - ((Vec3d<float> *)(pfVar7 + -2))->x)
                             );
            auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar29,auVar29);
            auVar30 = ZEXT416((uint)(fVar28 - *pfVar7));
            auVar29 = vfmadd231ss_fma(auVar29,auVar30,auVar30);
            if (auVar29._0_4_ < auVar32._0_4_) {
              auVar32 = ZEXT1664(auVar29);
              outputIndices[uVar5] = (HaU32)uVar9;
            }
            fVar31 = auVar32._0_4_;
            uVar9 = uVar9 + 1;
            pfVar7 = pfVar7 + 3;
          } while (uVar13 != uVar9);
        }
        uVar9 = (ulong)outputIndices[uVar5];
        fVar27 = fVar27 + fVar31;
        uVar5 = uVar5 + 1;
        __s[uVar9] = __s[uVar9] + 1;
        uVar1 = *(undefined8 *)((long)__s_00 + uVar9 * 0xc);
        auVar29._0_4_ = (float)(undefined4)uVar14 + (float)uVar1;
        auVar29._4_4_ = (float)uVar14._4_4_ + (float)((ulong)uVar1 >> 0x20);
        auVar29._8_8_ = 0;
        uVar1 = vmovlps_avx(auVar29);
        *(undefined8 *)((long)__s_00 + uVar9 * 0xc) = uVar1;
        *(float *)((long)__s_00 + uVar9 * 0xc + 8) =
             fVar28 + *(float *)((long)__s_00 + uVar9 * 0xc + 8);
      } while (uVar5 != inputCount);
      if (clumpCount != 0) {
        sVar12 = 0;
        piVar8 = __s;
        do {
          if (*piVar8 != 0) {
            auVar18 = vcvtusi2ss_avx512f(in_XMM11,*piVar8);
            fVar28 = 1.0 / auVar18._0_4_;
            auVar30._0_4_ = fVar28 * (float)*(undefined8 *)((long)__s_00 + sVar12);
            auVar30._4_4_ = fVar28 * (float)((ulong)*(undefined8 *)((long)__s_00 + sVar12) >> 0x20);
            auVar30._8_4_ = fVar28 * 0.0;
            auVar30._12_4_ = fVar28 * 0.0;
            uVar1 = vmovlps_avx(auVar30);
            *(undefined8 *)((long)__s_00 + sVar12) = uVar1;
            *(float *)((long)__s_00 + sVar12 + 8) = fVar28 * *(float *)((long)__s_00 + sVar12 + 8);
            *(undefined4 *)((long)&clusters->z + sVar12) =
                 *(undefined4 *)((long)__s_00 + sVar12 + 8);
            *(undefined8 *)((long)&clusters->x + sVar12) = *(undefined8 *)((long)__s_00 + sVar12);
          }
          piVar8 = piVar8 + 1;
          sVar12 = sVar12 + 0xc;
        } while (__size != sVar12);
      }
      iVar15 = iVar15 + -1;
    } while (((iVar15 != 0) && (threshold <= fVar27)) &&
            (auVar3._8_4_ = 0x7fffffff, auVar3._0_8_ = 0x7fffffff7fffffff,
            auVar3._12_4_ = 0x7fffffff,
            auVar18 = vandps_avx512vl(ZEXT416((uint)(fVar27 - fVar33)),auVar3), fVar33 = fVar27,
            threshold < auVar18._0_4_));
    free(__s_00);
LAB_0084e426:
    if (clumpCount != 0) {
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar13 = 0;
      HVar11 = 0;
      auVar22 = vpbroadcastq_avx512f();
      do {
        if (__s[uVar13] != 0) {
          uVar5 = (ulong)HVar11;
          if (HVar11 == 0) {
            bVar16 = false;
          }
          else {
            bVar16 = true;
            fVar33 = clusters[uVar13].y - clusters->y;
            auVar18 = ZEXT416((uint)(clusters[uVar13].x - clusters->x));
            auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),auVar18,auVar18);
            auVar29 = ZEXT416((uint)(clusters[uVar13].z - clusters->z));
            auVar18 = vfmadd231ss_fma(auVar18,auVar29,auVar29);
            if (collapseDistance * collapseDistance <= auVar18._0_4_) {
              uVar14 = 0;
              pfVar7 = &clusters[1].z;
              do {
                if (uVar5 - 1 == uVar14) {
                  bVar16 = false;
                  goto LAB_0084e518;
                }
                fVar27 = clusters[uVar13].y - pfVar7[-1];
                pVVar10 = (Vec3d<float> *)(pfVar7 + -2);
                fVar33 = *pfVar7;
                pfVar7 = pfVar7 + 3;
                uVar14 = uVar14 + 1;
                auVar18 = ZEXT416((uint)(clusters[uVar13].x - pVVar10->x));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),auVar18,auVar18);
                auVar29 = ZEXT416((uint)(clusters[uVar13].z - fVar33));
                auVar18 = vfmadd231ss_fma(auVar18,auVar29,auVar29);
              } while (collapseDistance * collapseDistance <= auVar18._0_4_);
              bVar16 = uVar14 < uVar5;
            }
          }
LAB_0084e518:
          if (((outputIndices != (HaU32 *)0x0) && (inputCount != 0)) && (uVar13 != uVar5 || bVar16))
          {
            auVar23 = vpbroadcastd_avx512f();
            auVar24 = vpbroadcastq_avx512f();
            uVar14 = 0;
            do {
              auVar25 = vpbroadcastq_avx512f();
              auVar26 = vporq_avx512f(auVar25,auVar32);
              auVar25 = vporq_avx512f(auVar25,auVar21);
              uVar1 = vpcmpuq_avx512f(auVar25,auVar22,2);
              uVar2 = vpcmpuq_avx512f(auVar26,auVar22,2);
              bVar4 = (byte)uVar2;
              uVar17 = CONCAT11(bVar4,(byte)uVar1);
              auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])(outputIndices + uVar14));
              auVar19._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
              auVar19._0_4_ = (uint)((byte)uVar1 & 1) * auVar25._0_4_;
              auVar19._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
              auVar19._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
              auVar19._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar25._16_4_;
              auVar19._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar25._20_4_;
              auVar19._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar25._24_4_;
              auVar19._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar25._28_4_;
              auVar26._32_4_ = (uint)(bVar4 & 1) * auVar25._32_4_;
              auVar26._0_32_ = auVar19;
              auVar26._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar25._36_4_;
              auVar26._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar25._40_4_;
              auVar26._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar25._44_4_;
              auVar26._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar25._48_4_;
              auVar26._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar25._52_4_;
              auVar26._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar25._56_4_;
              auVar26._60_4_ = (uint)(bVar4 >> 7) * auVar25._60_4_;
              auVar20 = vextracti64x4_avx512f(auVar26,1);
              auVar25 = vpmovzxdq_avx512f(auVar19);
              auVar26 = vpmovzxdq_avx512f(auVar20);
              vpcmpeqq_avx512f(auVar24,auVar25);
              vpcmpeqq_avx512f(auVar24,auVar26);
              auVar25 = vmovdqu32_avx512f(auVar23);
              *(undefined1 (*) [64])(outputIndices + uVar14) = auVar25;
              uVar14 = uVar14 + 0x10;
            } while (((ulong)inputCount + 0xf & 0xfffffffffffffff0) != uVar14);
          }
          if (!bVar16) {
            HVar11 = HVar11 + 1;
            clusters[uVar5].z = clusters[uVar13].z;
            fVar33 = clusters[uVar13].y;
            clusters[uVar5].x = clusters[uVar13].x;
            clusters[uVar5].y = fVar33;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != clumpCount);
      goto LAB_0084e5e0;
    }
  }
  else if (inputCount != 0) {
    uVar13 = 0;
    pVVar10 = clusters;
    do {
      if (outputIndices != (HaU32 *)0x0) {
        outputIndices[uVar13] = (HaU32)uVar13;
      }
      pVVar10->z = input->z;
      pfVar7 = &input->x;
      fVar33 = input->y;
      input = input + 1;
      pVVar10->x = *pfVar7;
      pVVar10->y = fVar33;
      __s[uVar13] = 1;
      uVar13 = uVar13 + 1;
      pVVar10 = pVVar10 + 1;
      clumpCount = inputCount;
    } while (inputCount != uVar13);
    goto LAB_0084e426;
  }
  HVar11 = 0;
LAB_0084e5e0:
  free(__s);
  return HVar11;
}

Assistant:

hacd::HaU32	kmeans_cluster(const Vec *input,
						   hacd::HaU32 inputCount,
						   hacd::HaU32 clumpCount,
						   Vec *clusters,
						   hacd::HaU32 *outputIndices,
						   Type threshold, // controls how long it works to converge towards a least errors solution.
						   Type collapseDistance) // distance between clumps to consider them to be essentially equal.
{
	hacd::HaU32 convergeCount = 64; // maximum number of iterations attempting to converge to a solution..
	hacd::HaU32 *counts = (hacd::HaU32 *)HACD_ALLOC(sizeof(hacd::HaU32)*clumpCount);
	Type error=0;
	if ( inputCount <= clumpCount ) // if the number of input points is less than our clumping size, just return the input points.
	{
		clumpCount = inputCount;
		for (hacd::HaU32 i=0; i<inputCount; i++)
		{
			if ( outputIndices )
			{
				outputIndices[i] = i;
			}
			clusters[i] = input[i];
			counts[i] = 1;
		}
	}
	else
	{
		Vec *centroids = (Vec *)HACD_ALLOC(sizeof(Vec)*clumpCount);

		// Take a sampling of the input points as initial centroid estimates.
		for (hacd::HaU32 i=0; i<clumpCount; i++)
		{
			hacd::HaU32 index = (i*inputCount)/clumpCount;
			assert( index >= 0 && index < inputCount );
			clusters[i] = input[index];
		}

		// Here is the main convergence loop
		Type old_error = FLT_MAX;	// old and initial error estimates are max Type
		error = FLT_MAX;
		do
		{
			old_error = error;	// preserve the old error
			// reset the counts and centroids to current cluster location
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				counts[i] = 0;
				centroids[i].zero();
			}
			error = 0;
			// For each input data point, figure out which cluster it is closest too and add it to that cluster.
			for (hacd::HaU32 i=0; i<inputCount; i++)
			{
				Type min_distance = FLT_MAX;
				// find the nearest clump to this point.
				for (hacd::HaU32 j=0; j<clumpCount; j++)
				{
					Type distance = input[i].distanceSquared( clusters[j] );
					if ( distance < min_distance )
					{
						min_distance = distance;
						outputIndices[i] = j; // save which clump this point indexes
					}
				}
				hacd::HaU32 index = outputIndices[i]; // which clump was nearest to this point.
				centroids[index]+=input[i];
				counts[index]++;	// increment the counter indicating how many points are in this clump.
				error+=min_distance; // save the error accumulation
			}
			// Now, for each clump, compute the mean and store the result.
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				if ( counts[i] ) // if this clump got any points added to it...
				{
					Type recip = 1.0f / (Type)counts[i];	// compute the average (center of those points)
					centroids[i]*=recip;	// compute the average center of the points in this clump.
					clusters[i] = centroids[i]; // store it as the new cluster.
				}
			}
			// decrement the convergence counter and bail if it is taking too long to converge to a solution.
			convergeCount--;
			if (convergeCount == 0 )
			{
				break;
			}
			if ( error < threshold ) // early exit if our first guess is already good enough (if all input points are the same)
				break;
		} while ( fabs(error - old_error) > threshold ); // keep going until the error is reduced by this threshold amount.

		HACD_FREE(centroids);
	}

	// ok..now we prune the clumps if necessary.
	// The rules are; first, if a clump has no 'counts' then we prune it as it's unused.
	// The second, is if the centroid of this clump is essentially  the same (based on the distance tolerance)
	// as an existing clump, then it is pruned and all indices which used to point to it, now point to the one
	// it is closest too.
	hacd::HaU32 outCount = 0; // number of clumps output after pruning performed.
	Type d2 = collapseDistance*collapseDistance; // squared collapse distance.
	for (hacd::HaU32 i=0; i<clumpCount; i++)
	{
		if ( counts[i] == 0 ) // if no points ended up in this clump, eliminate it.
			continue;
		// see if this clump is too close to any already accepted clump.
		bool add = true;
		hacd::HaU32 remapIndex = outCount; // by default this clump will be remapped to its current index.
		for (hacd::HaU32 j=0; j<outCount; j++)
		{
			Type distance = clusters[i].distanceSquared(clusters[j]);
			if ( distance < d2 )
			{
				remapIndex = j;
				add = false; // we do not add this clump
				break;
			}
		}
		// If we have fewer output clumps than input clumps so far, then we need to remap the old indices to the new ones.
		if ( outputIndices )
		{
			if ( outCount != i || !add ) // we need to remap indices!  everything that was index 'i' now needs to be remapped to 'outCount'
			{
				for (hacd::HaU32 j=0; j<inputCount; j++)
				{
					if ( outputIndices[j] == i )
					{
						outputIndices[j] = remapIndex; //
					}
				}
			}
		}
		if ( add )
		{
			clusters[outCount] = clusters[i];
			outCount++;
		}
	}
	HACD_FREE(counts);
	clumpCount = outCount;
	return clumpCount;
}